

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

void check_object_curses(object *obj)

{
  int local_14;
  wchar_t i;
  object *obj_local;
  
  local_14 = 0;
  while( true ) {
    if ((int)(uint)z_info->curse_max <= local_14) {
      mem_free(obj->curses);
      obj->curses = (curse_data *)0x0;
      return;
    }
    if (obj->curses[local_14].power != L'\0') break;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

static void check_object_curses(struct object *obj)
{
	int i;

	/* Look for a valid curse, return if one found */
	for (i = 0; i < z_info->curse_max; i++) {
		if (obj->curses[i].power) {
			return;
		}
	}

	/* Free the curse structure */
	mem_free(obj->curses);
	obj->curses = NULL;
}